

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  uint uVar3;
  FKey **ppFVar4;
  
  uVar3 = 0;
  if ((pParse->db->flags & 0x80000) != 0) {
    if (aChange != (int *)0x0) {
      ppFVar4 = &pTab->pFKey;
      while (pFVar2 = *ppFVar4, pFVar2 != (FKey *)0x0) {
        iVar1 = fkChildIsModified(pTab,pFVar2,aChange,chngRowid);
        ppFVar4 = &pFVar2->pNextFrom;
        if (iVar1 != 0) {
          return 1;
        }
      }
      pFVar2 = sqlite3FkReferences(pTab);
      while( true ) {
        if (pFVar2 == (FKey *)0x0) {
          return 0;
        }
        iVar1 = fkParentIsModified(pTab,pFVar2,aChange,chngRowid);
        if (iVar1 != 0) break;
        pFVar2 = pFVar2->pNextTo;
      }
      return 1;
    }
    pFVar2 = sqlite3FkReferences(pTab);
    if (pFVar2 == (FKey *)0x0) {
      uVar3 = (uint)(pTab->pFKey != (FKey *)0x0);
    }
    else {
      uVar3 = 1;
    }
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      return (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ) return 1;
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ) return 1;
      }
    }
  }
  return 0;
}